

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O3

void wasm::OptUtils::optimizeAfterInlining(FuncSet *funcs,Module *module,PassRunner *parentRunner)

{
  bool bVar1;
  int iVar2;
  undefined1 local_2a8 [8];
  FilteredPassRunner runner;
  
  iVar2 = PassRunner::getPassDebug();
  if (1 < iVar2) {
    bVar1 = WasmValidator::validate
                      ((WasmValidator *)&runner.relevantFuncs,module,&parentRunner->options);
    if (!bVar1) {
      Fatal::Fatal((Fatal *)&runner.relevantFuncs);
      Fatal::operator<<((Fatal *)&runner.relevantFuncs,
                        (char (*) [42])"invalid wasm before optimizeAfterInlining");
      goto LAB_0082e1b4;
    }
  }
  PassUtils::FilteredPassRunner::FilteredPassRunner
            ((FilteredPassRunner *)local_2a8,module,funcs,&parentRunner->options);
  runner.super_PassRunner.options.passesToSkip._M_h._M_single_bucket._0_1_ = 1;
  addUsefulPassesAfterInlining((PassRunner *)local_2a8);
  PassRunner::run((PassRunner *)local_2a8);
  iVar2 = PassRunner::getPassDebug();
  if (1 < iVar2) {
    bVar1 = WasmValidator::validate
                      ((WasmValidator *)&runner.relevantFuncs,module,&parentRunner->options);
    if (!bVar1) {
      Fatal::Fatal((Fatal *)&runner.relevantFuncs);
      Fatal::operator<<((Fatal *)&runner.relevantFuncs,
                        (char (*) [41])"invalid wasm after optimizeAfterInlining");
LAB_0082e1b4:
      Fatal::~Fatal((Fatal *)&runner.relevantFuncs);
    }
  }
  PassRunner::~PassRunner((PassRunner *)local_2a8);
  return;
}

Assistant:

inline void optimizeAfterInlining(const PassUtils::FuncSet& funcs,
                                  Module* module,
                                  PassRunner* parentRunner) {
  // In pass-debug mode, validate before and after these optimizations. This
  // helps catch bugs in the middle of passes like inlining and dae. We do this
  // at level 2+ and not 1 so that this extra validation is not added to the
  // timings that level 1 reports.
  if (PassRunner::getPassDebug() >= 2) {
    if (!WasmValidator().validate(*module, parentRunner->options)) {
      Fatal() << "invalid wasm before optimizeAfterInlining";
    }
  }
  PassUtils::FilteredPassRunner runner(module, funcs, parentRunner->options);
  runner.setIsNested(true);
  addUsefulPassesAfterInlining(runner);
  runner.run();
  if (PassRunner::getPassDebug() >= 2) {
    if (!WasmValidator().validate(*module, parentRunner->options)) {
      Fatal() << "invalid wasm after optimizeAfterInlining";
    }
  }
}